

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OoutReportTextTest.cpp
# Opt level: O0

void __thiscall OoutReportTextTest::OoutReportTextTest(OoutReportTextTest *this)

{
  shared_ptr<oout::ContainMatch> local_208;
  shared_ptr<oout::ErrorResult> local_1f8;
  shared_ptr<oout::ErrorResult> local_1e8;
  shared_ptr<oout::NamedResult> local_1d8;
  shared_ptr<oout::NamedResult> local_1c8;
  shared_ptr<oout::ContainMatch> local_1b8;
  shared_ptr<oout::NamedTest> local_1a8;
  shared_ptr<oout::ContainMatch> local_198;
  shared_ptr<oout::ContainMatch> local_188;
  shared_ptr<oout::ContainMatch> local_178;
  shared_ptr<oout::ErrorResult> local_168;
  shared_ptr<oout::ErrorResult> local_158;
  shared_ptr<oout::NamedResult> local_148;
  shared_ptr<oout::ContainMatch> local_138;
  shared_ptr<oout::NamedTest> local_128;
  shared_ptr<oout::ContainMatch> local_118;
  shared_ptr<oout::ContainMatch> local_108;
  shared_ptr<oout::ContainMatch> local_f8;
  shared_ptr<oout::FailureResult> local_e8;
  shared_ptr<oout::FailureResult> local_d8;
  shared_ptr<oout::NamedResult> local_c8;
  shared_ptr<oout::ContainMatch> local_b8;
  shared_ptr<oout::NamedTest> local_a8;
  shared_ptr<oout::ContainMatch> local_98;
  shared_ptr<oout::SuccessResult> local_88;
  shared_ptr<oout::SuccessResult> local_78;
  shared_ptr<oout::ContainMatch> local_68;
  shared_ptr<oout::NamedTest> local_58 [2];
  allocator<char> local_31;
  string local_30;
  OoutReportTextTest *local_10;
  OoutReportTextTest *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"OoutReportText tests",&local_31);
  std::make_shared<oout::SuccessResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::SuccessResult>>(&local_78);
  std::make_shared<oout::OoutReportText,std::shared_ptr<oout::TestResult>>
            ((shared_ptr<oout::TestResult> *)&local_68);
  std::make_shared<oout::ContainMatch,char_const(&)[20]>((char (*) [20])&local_98);
  std::
  make_shared<oout::NamedTest,char_const(&)[42],std::shared_ptr<oout::OoutReportText>,std::shared_ptr<oout::ContainMatch>>
            ((char (*) [42])local_58,
             (shared_ptr<oout::OoutReportText> *)"OoutReportText should show summary string",
             &local_68);
  std::make_shared<oout::FailureResult,char_const(&)[8]>((char (*) [8])&local_e8);
  std::make_shared<oout::TestResult,std::shared_ptr<oout::FailureResult>>(&local_d8);
  std::make_shared<oout::NamedResult,char_const(&)[10],std::shared_ptr<oout::TestResult>>
            ((char (*) [10])&local_c8,(shared_ptr<oout::TestResult> *)0x2c5204);
  std::make_shared<oout::OoutReportText,std::shared_ptr<oout::NamedResult>>
            ((shared_ptr<oout::NamedResult> *)&local_b8);
  std::make_shared<oout::ContainMatch,char_const(&)[19]>((char (*) [19])&local_f8);
  std::make_shared<oout::ContainMatch,char_const(&)[8]>((char (*) [8])&local_108);
  std::make_shared<oout::ContainMatch,char_const(&)[20]>((char (*) [20])&local_118);
  std::
  make_shared<oout::NamedTest,char_const(&)[39],std::shared_ptr<oout::OoutReportText>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>>
            ((char (*) [39])&local_a8,
             (shared_ptr<oout::OoutReportText> *)"OoutReportText should show failed test",&local_b8,
             &local_f8,&local_108);
  std::make_shared<oout::ErrorResult,char_const(&)[6]>((char (*) [6])&local_168);
  std::make_shared<oout::TestResult,std::shared_ptr<oout::ErrorResult>>(&local_158);
  std::make_shared<oout::NamedResult,char_const(&)[10],std::shared_ptr<oout::TestResult>>
            ((char (*) [10])&local_148,(shared_ptr<oout::TestResult> *)0x2c5204);
  std::make_shared<oout::OoutReportText,std::shared_ptr<oout::NamedResult>>
            ((shared_ptr<oout::NamedResult> *)&local_138);
  std::make_shared<oout::ContainMatch,char_const(&)[17]>((char (*) [17])&local_178);
  std::make_shared<oout::ContainMatch,char_const(&)[6]>((char (*) [6])&local_188);
  std::make_shared<oout::ContainMatch,char_const(&)[20]>((char (*) [20])&local_198);
  std::
  make_shared<oout::NamedTest,char_const(&)[38],std::shared_ptr<oout::OoutReportText>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>>
            ((char (*) [38])&local_128,
             (shared_ptr<oout::OoutReportText> *)"OoutReportText should show error test",&local_138,
             &local_178,&local_188);
  std::make_shared<oout::ErrorResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::ErrorResult>>(&local_1e8);
  std::make_shared<oout::NamedResult,char_const(&)[18],std::shared_ptr<oout::TestResult>>
            ((char (*) [18])&local_1d8,(shared_ptr<oout::TestResult> *)0x2c5287);
  std::make_shared<oout::SuiteResult,std::shared_ptr<oout::NamedResult>>(&local_1c8);
  std::make_shared<oout::OoutReportText,std::shared_ptr<oout::SuiteResult>>
            ((shared_ptr<oout::SuiteResult> *)&local_1b8);
  std::make_shared<oout::ContainMatch,char_const(&)[25]>((char (*) [25])&local_208);
  std::
  make_shared<oout::NamedTest,char_const(&)[39],std::shared_ptr<oout::OoutReportText>,std::shared_ptr<oout::ContainMatch>>
            ((char (*) [39])&local_1a8,
             (shared_ptr<oout::OoutReportText> *)"OoutReportText should show suite tests",&local_1b8
            );
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
            (&this->super_Test,&local_30,local_58,&local_a8,&local_128,&local_1a8);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(&local_1a8);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr(&local_208);
  std::shared_ptr<oout::OoutReportText>::~shared_ptr((shared_ptr<oout::OoutReportText> *)&local_1b8)
  ;
  std::shared_ptr<oout::SuiteResult>::~shared_ptr((shared_ptr<oout::SuiteResult> *)&local_1c8);
  std::shared_ptr<oout::NamedResult>::~shared_ptr(&local_1d8);
  std::shared_ptr<oout::TestResult>::~shared_ptr((shared_ptr<oout::TestResult> *)&local_1e8);
  std::shared_ptr<oout::ErrorResult>::~shared_ptr(&local_1f8);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(&local_128);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr(&local_198);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr(&local_188);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr(&local_178);
  std::shared_ptr<oout::OoutReportText>::~shared_ptr((shared_ptr<oout::OoutReportText> *)&local_138)
  ;
  std::shared_ptr<oout::NamedResult>::~shared_ptr(&local_148);
  std::shared_ptr<oout::TestResult>::~shared_ptr((shared_ptr<oout::TestResult> *)&local_158);
  std::shared_ptr<oout::ErrorResult>::~shared_ptr(&local_168);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(&local_a8);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr(&local_118);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr(&local_108);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr(&local_f8);
  std::shared_ptr<oout::OoutReportText>::~shared_ptr((shared_ptr<oout::OoutReportText> *)&local_b8);
  std::shared_ptr<oout::NamedResult>::~shared_ptr(&local_c8);
  std::shared_ptr<oout::TestResult>::~shared_ptr((shared_ptr<oout::TestResult> *)&local_d8);
  std::shared_ptr<oout::FailureResult>::~shared_ptr(&local_e8);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(local_58);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr(&local_98);
  std::shared_ptr<oout::OoutReportText>::~shared_ptr((shared_ptr<oout::OoutReportText> *)&local_68);
  std::shared_ptr<oout::TestResult>::~shared_ptr((shared_ptr<oout::TestResult> *)&local_78);
  std::shared_ptr<oout::SuccessResult>::~shared_ptr(&local_88);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__OoutReportTextTest_003244c0;
  return;
}

Assistant:

OoutReportTextTest::OoutReportTextTest()
: dirty::Test(
	"OoutReportText tests",
	make_shared<NamedTest>(
		"OoutReportText should show summary string",
		make_shared<OoutReportText>(
			make_shared<TestResult>(make_shared<SuccessResult>())
		),
		make_shared<ContainMatch>("0 of 1 tests failed")
	),
	make_shared<NamedTest>(
		"OoutReportText should show failed test",
		make_shared<OoutReportText>(
			make_shared<NamedResult>(
				"Test name",
				make_shared<TestResult>(make_shared<FailureResult>("failure"))
			)
		),
		make_shared<ContainMatch>("FAILURE: Test name"),
		make_shared<ContainMatch>("failure"),
		make_shared<ContainMatch>("1 of 1 tests failed")
	),
	make_shared<NamedTest>(
		"OoutReportText should show error test",
		make_shared<OoutReportText>(
			make_shared<NamedResult>(
				"Test name",
				make_shared<TestResult>(make_shared<ErrorResult>("error"))
			)
		),
		make_shared<ContainMatch>("ERROR: Test name"),
		make_shared<ContainMatch>("error"),
		make_shared<ContainMatch>("1 of 1 tests failed")
	),
	make_shared<NamedTest>(
		"OoutReportText should show suite tests",
		make_shared<OoutReportText>(
			make_shared<SuiteResult>(
				make_shared<NamedResult>(
					"Suite failed test",
					make_shared<TestResult>(make_shared<ErrorResult>())
				)
			)
		),
		make_shared<ContainMatch>("ERROR: Suite failed test")
	)
)
{
}